

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O0

void __thiscall Merlin::Merlin(Merlin *this)

{
  Merlin *this_local;
  
  std::__cxx11::string::string((string *)&this->m_modelFile);
  std::__cxx11::string::string((string *)&this->m_evidenceFile);
  std::__cxx11::string::string((string *)&this->m_virtualEvidenceFile);
  std::__cxx11::string::string((string *)&this->m_queryFile);
  std::__cxx11::string::string((string *)&this->m_outputFile);
  std::__cxx11::string::string((string *)&this->m_datasetFile);
  std::__cxx11::string::string((string *)&this->m_modelString);
  std::__cxx11::string::string((string *)&this->m_evidenceString);
  std::__cxx11::string::string((string *)&this->m_virtualEvidenceString);
  std::__cxx11::string::string((string *)&this->m_queryString);
  std::__cxx11::string::string((string *)&this->m_outputString);
  std::__cxx11::string::string((string *)&this->m_datasetString);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map(&this->m_evidence);
  std::
  map<unsigned_long,_std::vector<double,_std::allocator<double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::map(&this->m_virtualEvidence);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_query);
  std::__cxx11::string::string((string *)&this->m_filename);
  std::
  vector<std::vector<merlin::observation,_std::allocator<merlin::observation>_>,_std::allocator<std::vector<merlin::observation,_std::allocator<merlin::observation>_>_>_>
  ::vector(&this->m_dataset);
  this->m_task = 0x14;
  this->m_algorithm = 0x3ec;
  this->m_ibound = 4;
  this->m_iterations = 100;
  this->m_samples = 100;
  this->m_gmo = (graphical_model *)0x0;
  this->m_debug = false;
  this->m_useFiles = true;
  this->m_outputFormat = 10;
  this->m_ioTime = 0.0;
  this->m_positive = false;
  this->m_threshold = 1e-06;
  return;
}

Assistant:

Merlin::Merlin() {
	m_task = MERLIN_TASK_MAR;
	m_algorithm = MERLIN_ALGO_WMB;
	m_ibound = 4;
	m_iterations = 100;
	m_samples = 100;
	m_gmo = NULL;
	m_debug = false;
	m_useFiles = true; // default: use input files
	m_outputFormat = MERLIN_OUTPUT_UAI;
	m_ioTime = 0;
	m_positive = false;
	m_threshold = 1e-06;
}